

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::CommandLineInterface::InitializeDiskSourceTree
          (CommandLineInterface *this,DiskSourceTree *source_tree,
          DescriptorDatabase *fallback_database)

{
  pointer ppVar1;
  bool bVar2;
  ssize_t sVar3;
  size_type sVar4;
  char *extraout_RDX;
  char *extraout_RDX_00;
  long lVar5;
  size_t i;
  ulong uVar6;
  string_view path;
  string_view path_00;
  string_view path_01;
  string_view virtual_path;
  string_view disk_path;
  basic_string_view<char,_std::char_traits<char>_> local_10d8;
  string include_path;
  string path_str;
  string local_1088;
  AlphaNum local_1068;
  char buffer [4096];
  
  path_str._M_dataplus._M_p = (pointer)&path_str.field_2;
  path_str._M_string_length = 0;
  path_str.field_2._M_local_buf[0] = '\0';
  sVar3 = readlink("/proc/self/exe",buffer,0x1000);
  if ((int)sVar3 < 1) goto LAB_0013af53;
  std::__cxx11::string::assign((char *)&path_str,(ulong)buffer);
  local_10d8._M_str = path_str._M_dataplus._M_p;
  local_10d8._M_len = path_str._M_string_length;
  sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_of
                    (&local_10d8,"/\\",0xffffffffffffffff);
  if (sVar4 + 1 < 2) goto LAB_0013af53;
  local_10d8 = std::basic_string_view<char,_std::char_traits<char>_>::substr(&local_10d8,0,sVar4);
  path._M_str = local_10d8._M_str;
  path._M_len = (size_t)path._M_str;
  bVar2 = anon_unknown_5::IsInstalledProtoPath((anon_unknown_5 *)local_10d8._M_len,path);
  if (bVar2) {
    std::
    vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[1],std::basic_string_view<char,std::char_traits<char>>&>
              ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                *)&this->proto_path_,(char (*) [1])0x4168cc,&local_10d8);
    goto LAB_0013af53;
  }
  buffer._0_16_ = (undefined1  [16])local_10d8;
  local_1068.piece_ = absl::lts_20250127::NullSafeStringView("/include");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&include_path,(lts_20250127 *)buffer,&local_1068,&local_1068);
  path_00._M_str = extraout_RDX;
  path_00._M_len = (size_t)include_path._M_dataplus._M_p;
  bVar2 = anon_unknown_5::IsInstalledProtoPath
                    ((anon_unknown_5 *)include_path._M_string_length,path_00);
  if (bVar2) {
LAB_0013ae90:
    std::
    vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[1],std::__cxx11::string>
              ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                *)&this->proto_path_,(char (*) [1])0x4168cc,&include_path);
  }
  else {
    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_of
                      (&local_10d8,"/\\",0xffffffffffffffff);
    if (1 < sVar4 + 1) {
      local_10d8 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                             (&local_10d8,0,sVar4);
      buffer._0_16_ = (undefined1  [16])local_10d8;
      local_1068.piece_ = absl::lts_20250127::NullSafeStringView("/include");
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_1088,(lts_20250127 *)buffer,&local_1068,&local_1068);
      std::__cxx11::string::operator=((string *)&include_path,(string *)&local_1088);
      std::__cxx11::string::~string((string *)&local_1088);
      path_01._M_str = extraout_RDX_00;
      path_01._M_len = (size_t)include_path._M_dataplus._M_p;
      bVar2 = anon_unknown_5::IsInstalledProtoPath
                        ((anon_unknown_5 *)include_path._M_string_length,path_01);
      if (bVar2) goto LAB_0013ae90;
    }
  }
  std::__cxx11::string::~string((string *)&include_path);
LAB_0013af53:
  std::__cxx11::string::~string((string *)&path_str);
  lVar5 = 0x28;
  for (uVar6 = 0;
      ppVar1 = (this->proto_path_).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar6 < (ulong)((long)(this->proto_path_).
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 6);
      uVar6 = uVar6 + 1) {
    virtual_path._M_str = *(char **)((long)ppVar1 + lVar5 + -0x28);
    virtual_path._M_len = *(size_t *)((long)ppVar1 + lVar5 + -0x20);
    disk_path._M_str = *(char **)((long)ppVar1 + lVar5 + -8);
    disk_path._M_len = *(size_t *)((long)&(ppVar1->first)._M_dataplus._M_p + lVar5);
    DiskSourceTree::MapPath(source_tree,virtual_path,disk_path);
    lVar5 = lVar5 + 0x40;
  }
  bVar2 = MakeInputsBeProtoPathRelative(this,source_tree,fallback_database);
  return bVar2;
}

Assistant:

bool CommandLineInterface::InitializeDiskSourceTree(
    DiskSourceTree* source_tree, DescriptorDatabase* fallback_database) {
  AddDefaultProtoPaths(&proto_path_);

  // Set up the source tree.
  for (size_t i = 0; i < proto_path_.size(); ++i) {
    source_tree->MapPath(proto_path_[i].first, proto_path_[i].second);
  }

  // Map input files to virtual paths if possible.
  if (!MakeInputsBeProtoPathRelative(source_tree, fallback_database)) {
    return false;
  }

  return true;
}